

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplingManager.cpp
# Opt level: O1

ssize_t __thiscall
jaegertracing::sampling_manager::thrift::SamplingManager_getSamplingStrategy_pargs::write
          (SamplingManager_getSamplingStrategy_pargs *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"SamplingManager_getSamplingStrategy_pargs");
  iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"serviceName",0xb,1);
  iVar3 = (*this_00->_vptr_TProtocol[0x15])(this_00,this->serviceName);
  iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar6 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar5 + iVar6 + iVar3 + iVar4 + iVar2 + iVar1);
}

Assistant:

uint32_t SamplingManager_getSamplingStrategy_pargs::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SamplingManager_getSamplingStrategy_pargs");

  xfer += oprot->writeFieldBegin("serviceName", ::apache::thrift::protocol::T_STRING, 1);
  xfer += oprot->writeString((*(this->serviceName)));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}